

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> * __thiscall
cmGeneratorTarget::GetUtilityItems(cmGeneratorTarget *this)

{
  cmTarget *pcVar1;
  cmGeneratorTarget *pcVar2;
  _Base_ptr p_Var3;
  cmLinkItem local_58;
  
  if (this->UtilityItemsDone == false) {
    this->UtilityItemsDone = true;
    pcVar1 = this->Target;
    for (p_Var3 = (pcVar1->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(pcVar1->Utilities)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      pcVar2 = cmLocalGenerator::FindGeneratorTargetToUse
                         (this->LocalGenerator,(string *)(p_Var3 + 1));
      std::__cxx11::string::string((string *)&local_58,(string *)(p_Var3 + 1));
      local_58.Target = pcVar2;
      std::
      _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
      ::_M_insert_unique<cmLinkItem>(&(this->UtilityItems)._M_t,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return &this->UtilityItems;
}

Assistant:

std::set<cmLinkItem> const& cmGeneratorTarget::GetUtilityItems() const
{
  if (!this->UtilityItemsDone) {
    this->UtilityItemsDone = true;
    std::set<std::string> const& utilities = this->GetUtilities();
    for (std::set<std::string>::const_iterator i = utilities.begin();
         i != utilities.end(); ++i) {
      cmGeneratorTarget* gt =
        this->LocalGenerator->FindGeneratorTargetToUse(*i);
      this->UtilityItems.insert(cmLinkItem(*i, gt));
    }
  }
  return this->UtilityItems;
}